

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O1

Gia_Man_t * Gia_ManFront(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  uint local_4c;
  
  uVar8 = Gia_ManCrossCutSimple(p);
  Gia_ManCreateValueRefs(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar11 = p->pName;
  if (pcVar11 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar11);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar11);
  }
  p_00->pName = pcVar10;
  pcVar11 = p->pSpec;
  if (pcVar11 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar11);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar11);
  }
  p_00->pSpec = pcVar10;
  iVar18 = (int)((float)(int)uVar8 * 1.1) + 1;
  p_00->nFront = iVar18;
  pcVar11 = (char *)calloc((long)iVar18,1);
  if ((int)((float)(int)uVar8 * 1.1) < 0) {
LAB_006dfac2:
    __assert_fail("iFront < nFront",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                  ,0x2f,"int Gia_ManFrontFindNext(char *, int, int)");
  }
  if (*pcVar11 == '\0') {
    lVar12 = 0;
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    do {
      uVar19 = (int)(uVar19 + 1) % iVar18;
      lVar12 = (long)(int)uVar19;
    } while (pcVar11[lVar12] != '\0');
  }
  pcVar11[lVar12] = '\x01';
  p_00->pObjs->Value = uVar19;
  bVar22 = p->pObjs->Value != 0;
  if (!bVar22) {
    pcVar11[(int)uVar19] = '\0';
  }
  uVar21 = (uint)bVar22;
  iVar18 = p->nObjs;
  local_4c = 0;
  if (1 < iVar18) {
    local_4c = 0;
    lVar12 = 1;
    do {
      pGVar1 = p->pObjs + lVar12;
      uVar20 = (uint)*(ulong *)pGVar1;
      if ((uVar20 & 0x9fffffff) == 0x9fffffff) {
        uVar20 = uVar21 + 1;
        if ((int)uVar21 < (int)local_4c) {
          uVar20 = local_4c;
        }
        if (pGVar1->Value != 0) {
          local_4c = uVar20;
          uVar21 = uVar21 + 1;
        }
        pGVar13 = Gia_ManAppendObj(p_00);
        uVar5 = *(ulong *)pGVar13;
        *(ulong *)pGVar13 = uVar5 | 0x9fffffff;
        *(ulong *)pGVar13 =
             uVar5 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar6 = p_00->pObjs;
        if ((pGVar13 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar13)) {
LAB_006dfa65:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555);
        pGVar6 = p_00->pObjs;
        if (pGVar13 < pGVar6) goto LAB_006dfa65;
        iVar18 = p_00->nObjs;
        if (pGVar6 + iVar18 <= pGVar13) goto LAB_006dfa65;
        uVar20 = (int)((long)pGVar13 - (long)pGVar6 >> 2) * -0x55555555;
        if ((uVar20 >> 0x1e & 1) != 0) {
LAB_006dfae1:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if (iVar18 <= (int)(uVar20 & 0x3fffffff)) goto LAB_006dfa84;
        uVar20 = uVar20 & 0x3fffffff;
        if ((((long)iVar18 <= (long)(ulong)uVar20) || (pGVar13 = p->pObjs, pGVar1 < pGVar13)) ||
           (pGVar13 + p->nObjs <= pGVar1)) goto LAB_006dfa65;
        if (uVar20 != (int)((ulong)((long)pGVar1 - (long)pGVar13) >> 2) * -0x55555555) {
          __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                        ,0xb4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
        }
        if (p_00->nFront <= (int)uVar19) goto LAB_006dfac2;
        for (; pcVar11[(int)uVar19] != '\0'; uVar19 = (int)(uVar19 + 1) % p_00->nFront) {
        }
        pcVar11[(int)uVar19] = '\x01';
        pGVar6[uVar20].Value = uVar19;
        if (pGVar1->Value == 0) {
          pcVar11[(int)uVar19] = '\0';
        }
      }
      else {
        iVar18 = (int)lVar12;
        if ((~uVar20 & 0x1fffffff) == 0 || -1 < (int)uVar20) {
          uVar20 = uVar21 + 1;
          if ((int)uVar21 < (int)local_4c) {
            uVar20 = local_4c;
          }
          if (pGVar1->Value != 0) {
            local_4c = uVar20;
            uVar21 = uVar21 + 1;
          }
          pGVar13 = Gia_ManAppendObj(p_00);
          pGVar6 = p_00->pObjs;
          if (((pGVar13 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar13)) ||
             ((pGVar7 = p->pObjs, pGVar1 < pGVar7 || (pGVar7 + p->nObjs <= pGVar1))))
          goto LAB_006dfa65;
          if ((int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555 !=
              (int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555) {
            __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xd4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar20 = iVar18 - (*(uint *)pGVar1 & 0x1fffffff);
          if (((int)uVar20 < 0) || (p_00->nObjs <= (int)uVar20)) {
LAB_006dfa84:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar6[uVar20].Value == 0x1fffffff) {
            __assert_fail("pFanin0New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xd7,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar14 = (ulong)(pGVar6[uVar20].Value & 0x1fffffff);
          uVar5 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar5 & 0xffffffffe0000000 | uVar14;
          uVar16 = (ulong)((uint)*(ulong *)pGVar1 & 0x20000000);
          *(ulong *)pGVar13 = uVar5 & 0xffffffffc0000000 | uVar14 | uVar16;
          uVar15 = iVar18 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
          if (((int)uVar15 < 0) || (p_00->nObjs <= (int)uVar15)) goto LAB_006dfa84;
          pGVar7 = p_00->pObjs;
          uVar3 = pGVar7[uVar15].Value;
          if (uVar3 == 0x1fffffff) {
            __assert_fail("pFanin1New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xdc,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar17 = (ulong)(uVar3 & 0x1fffffff) << 0x20;
          *(ulong *)pGVar13 = uVar5 & 0xe0000000c0000000 | uVar14 | uVar16 | uVar17;
          *(ulong *)pGVar13 =
               uVar5 & 0xc0000000c0000000 | uVar14 | uVar16 | uVar17 |
               *(ulong *)pGVar1 & 0x2000000000000000;
          if (p_00->nFront <= (int)uVar19) goto LAB_006dfac2;
          for (; pcVar11[(int)uVar19] != '\0'; uVar19 = (int)(uVar19 + 1) % p_00->nFront) {
          }
          pcVar11[(int)uVar19] = '\x01';
          pGVar13->Value = uVar19;
          puVar2 = &pGVar1[-(ulong)((uint)*(ulong *)pGVar1 & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            pcVar11[pGVar6[uVar20].Value] = '\0';
            uVar21 = uVar21 - 1;
          }
          puVar2 = &pGVar1[-(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            pcVar11[pGVar7[uVar15].Value] = '\0';
            uVar21 = uVar21 - 1;
          }
          if (pGVar1->Value == 0) {
            pcVar11[(int)uVar19] = '\0';
          }
        }
        else {
          if (pGVar1->Value != 0) {
            __assert_fail("Gia_ObjValue(pObj) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xbd,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          if (p_00->nObjs < 1) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)p_00->pObjs & 0x1fffffff) != 0 && (int)*(uint *)p_00->pObjs < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar13 = Gia_ManAppendObj(p_00);
          uVar5 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar5 | 0x80000000;
          pGVar6 = p_00->pObjs;
          if ((pGVar13 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar13)) goto LAB_006dfa65;
          uVar14 = (ulong)(((uint)((int)pGVar13 - (int)pGVar6) >> 2) * -0x55555555 & 0x1fffffff);
          *(ulong *)pGVar13 = uVar5 & 0xffffffffc0000000 | 0x80000000 | uVar14;
          *(ulong *)pGVar13 =
               uVar5 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
               (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar6 = p_00->pObjs;
          if ((pGVar13 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar13)) goto LAB_006dfa65;
          Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555);
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),
                             pGVar13);
          }
          pGVar6 = p_00->pObjs;
          if (pGVar13 < pGVar6) goto LAB_006dfa65;
          iVar4 = p_00->nObjs;
          if (pGVar6 + iVar4 <= pGVar13) goto LAB_006dfa65;
          uVar20 = (int)((long)pGVar13 - (long)pGVar6 >> 2) * -0x55555555;
          if ((uVar20 >> 0x1e & 1) != 0) goto LAB_006dfae1;
          if (iVar4 <= (int)(uVar20 & 0x3fffffff)) goto LAB_006dfa84;
          uVar20 = uVar20 & 0x3fffffff;
          if ((((long)iVar4 <= (long)(ulong)uVar20) || (pGVar13 = p->pObjs, pGVar1 < pGVar13)) ||
             (pGVar13 + p->nObjs <= pGVar1)) goto LAB_006dfa65;
          if (uVar20 != (int)((ulong)((long)pGVar1 - (long)pGVar13) >> 2) * -0x55555555) {
            __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xc1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          uVar15 = iVar18 - (*(uint *)pGVar1 & 0x1fffffff);
          if (((int)uVar15 < 0) || (iVar4 <= (int)uVar15)) goto LAB_006dfa84;
          if (pGVar6[uVar15].Value == 0x1fffffff) {
            __assert_fail("pFanin0New->Value != GIA_NONE",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                          ,0xc4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
          }
          pGVar13 = pGVar6 + uVar20;
          pGVar13->Value = 0x1fffffff;
          uVar14 = (ulong)pGVar6[uVar15].Value & 0x1fffffff;
          uVar5 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar5 & 0xffffffffe0000000 | uVar14;
          *(ulong *)pGVar13 =
               uVar5 & 0xffffffffc0000000 | uVar14 | (ulong)((uint)*(ulong *)pGVar1 & 0x20000000);
          puVar2 = &pGVar1[-(*(ulong *)pGVar1 & 0x1fffffff)].Value;
          *puVar2 = *puVar2 - 1;
          if (*puVar2 == 0) {
            pcVar11[pGVar6[uVar15].Value] = '\0';
            uVar21 = uVar21 - 1;
          }
        }
      }
      lVar12 = lVar12 + 1;
      iVar18 = p->nObjs;
    } while (lVar12 < iVar18);
  }
  if (p_00->nObjs != iVar18) {
    __assert_fail("pNew->nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                  ,0xf0,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
  }
  if ((uVar21 != 0) && (local_4c != uVar8)) {
    __assert_fail("nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                  ,0xf1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
  }
  if (0 < (long)p_00->nFront) {
    lVar12 = 0;
    do {
      if (pcVar11[lVar12] != '\0') {
        __assert_fail("pFront[i] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xf3,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      lVar12 = lVar12 + 1;
    } while (p_00->nFront != lVar12);
  }
  free(pcVar11);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFront( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFanin0New, * pFanin1New, * pObjNew;
    char * pFront;    // places used for the frontier
    int i, iLit, nCrossCut = 0, nCrossCutMax = 0;
    int nCrossCutMaxInit = Gia_ManCrossCutSimple( p );
    int iFront = 0;//, clk = Abc_Clock(); 
    // set references for all objects
    Gia_ManCreateValueRefs( p );
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nFront = 1 + (int)((float)1.1 * nCrossCutMaxInit); 
    // start the frontier
    pFront = ABC_CALLOC( char, pNew->nFront );
    // add constant node
    Gia_ManConst0(pNew)->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
    if ( Gia_ObjValue(Gia_ManConst0(p)) == 0 )
        pFront[iFront] = 0;
    else
        nCrossCut = 1;
    // iterate through the objects
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
                nCrossCutMax = nCrossCut;
            // create new node
            iLit = Gia_ManAppendCi( pNew );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
            // handle CIs without fanout
            if ( Gia_ObjValue(pObj) == 0 )
                pFront[iFront] = 0;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == 0 );
            // create new node
            iLit = Gia_ManAppendCo( pNew, 0 );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            // get the fanin
            pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
            assert( pFanin0New->Value != GIA_NONE );
            pObjNew->Value = GIA_NONE;
            pObjNew->iDiff0 = pFanin0New->Value;
            pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
            // deref the fanin
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
            {
                pFront[pFanin0New->Value] = 0;
                nCrossCut--;
            }
            continue;
        }
        if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
            nCrossCutMax = nCrossCut;
        // create new node
        pObjNew = Gia_ManAppendObj( pNew );
        assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
        // assign the first fanin
        pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
        assert( pFanin0New->Value != GIA_NONE );
        pObjNew->iDiff0 = pFanin0New->Value;
        pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
        // assign the second fanin
        pFanin1New = Gia_ManObj( pNew, Gia_ObjFaninId1(pObj, i) );
        assert( pFanin1New->Value != GIA_NONE );
        pObjNew->iDiff1 = pFanin1New->Value;
        pObjNew->fCompl1 = Gia_ObjFaninC1(pObj);
        // assign the frontier number
        pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
        // deref the fanins
        if ( --Gia_ObjFanin0(pObj)->Value == 0 )
        {
            pFront[pFanin0New->Value] = 0;
            nCrossCut--;
        }
        if ( --Gia_ObjFanin1(pObj)->Value == 0 )
        {
            pFront[pFanin1New->Value] = 0;
            nCrossCut--;
        }
        // handle nodes without fanout (choice nodes)
        if ( Gia_ObjValue(pObj) == 0 )
            pFront[iFront] = 0;
    }
    assert( pNew->nObjs == p->nObjs );
    assert( nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit );
    for ( i = 0; i < pNew->nFront; i++ )
        assert( pFront[i] == 0 );
    ABC_FREE( pFront );
//printf( "Crosscut = %6d. Frontier = %6d. ", nCrossCutMaxInit, pNew->nFront );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}